

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseImporter.cpp
# Opt level: O0

void __thiscall Assimp::BaseImporter::~BaseImporter(BaseImporter *this)

{
  code *pcVar1;
  BaseImporter *this_local;
  
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

BaseImporter::~BaseImporter() {
    // nothing to do here
}